

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void start_lisp(void)

{
  DLword *pDVar1;
  LispPTR *pLVar2;
  DLword *pDVar3;
  
  pLVar2 = NativeAligned4FromLAddr(*INTERRUPTSTATE_word);
  *(byte *)((long)pLVar2 + 3) = *(byte *)((long)pLVar2 + 3) & 0x1e;
  *(undefined2 *)pLVar2 = 0;
  MachineState.tosvalue = 0;
  MachineState.errorexit = 0;
  MachineState.pvar = Stackspace + (ulong)InterfacePage->currentfxp + 10;
  pDVar1 = Stackspace + Stackspace[(ulong)InterfacePage->currentfxp + 5];
  pDVar3 = pDVar1;
  if (*(short *)((ulong)pDVar1 ^ 2) != -0x6000) {
    error("Starting Lisp: Next stack block isn\'t free!");
  }
  while (*(short *)((ulong)pDVar3 ^ 2) == -0x6000) {
    MachineState.endofstack = pDVar3 + *(ushort *)((ulong)(pDVar3 + 1) ^ 2);
    pDVar3 = MachineState.endofstack;
  }
  MachineState.csp = pDVar1 + -2;
  MachineState.ivar =
       (DLword *)
       ((ulong)((uint)*(ushort *)((ulong)(MachineState.pvar + -0xb) ^ 2) * 2) + (long)Stackspace);
  MachineState.currentfunc = (fnhead *)NativeAligned4FromLAddr(*(LispPTR *)(MachineState.pvar + -8))
  ;
  MachineState.currentpc =
       (ByteCode *)((long)&(MachineState.currentfunc)->na + (ulong)MachineState.pvar[-6]);
  int_init();
  dispatch();
  return;
}

Assistant:

void start_lisp(void) {
  DLword *freeptr, *next68k;

/*******************************/
/*  First, turn off any pending interrupts from during VMEMSAVE.	*/
/*  This keeps US from trying to handle OLD interrupts.		*/
/*******************************/
#ifndef INIT
  {
    INTSTAT *intstate = ((INTSTAT *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word));
    intstate->ETHERInterrupt = 0;
    intstate->LogFileIO = 0;
    intstate->IOInterrupt = 0;
    intstate->waitinginterrupt = 0;
    intstate->intcharcode = 0;
  }
#endif /* INIT */

  TopOfStack = 0;
  Error_Exit = 0;

  PVar = NativeAligned2FromStackOffset(InterfacePage->currentfxp) + FRAMESIZE;

  freeptr = next68k = NativeAligned2FromStackOffset(CURRENTFX->nextblock);

  if (GETWORD(next68k) != STK_FSB_WORD) error("Starting Lisp: Next stack block isn't free!");

  while (GETWORD(freeptr) == STK_FSB_WORD) EndSTKP = freeptr = freeptr + GETWORD(freeptr + 1);

  CurrentStackPTR = next68k - 2;

  FastRetCALL;

  /* JRB - The interrupt initialization must be done right before  */
  /*       entering the bytecode dispatch loop; interrupts get     */
  /*       unblocked here 					   */
  int_init();
#ifdef DOS
  _dpmi_lockregion((void *)&dispatch, 32768);
#endif /* DOS */
  dispatch();
}